

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<char>>::
write_int<unsigned__int128,fmt::v6::basic_format_specs<char>>
          (basic_writer<fmt::v6::buffer_range<char>> *this,unsigned___int128 value,
          basic_format_specs<char> *spec)

{
  byte bVar1;
  byte bVar2;
  long in_RCX;
  undefined1 local_38 [32];
  char local_18;
  uint local_14;
  
  bVar1 = *(byte *)(in_RCX + 8);
  local_14 = 0;
  bVar2 = *(byte *)(in_RCX + 9) >> 4 & 7;
  if (1 < bVar2) {
    local_18 = ' ';
    if (bVar2 == 2) {
      local_18 = '+';
    }
    local_14 = 1;
  }
  local_38._0_8_ = this;
  local_38._16_8_ = spec;
  if (bVar1 < 0x62) {
    if (bVar1 < 0x4c) {
      if (bVar1 == 0) {
LAB_00128d09:
        basic_writer<fmt::v6::buffer_range<char>_>::
        int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::on_dec
                  ((int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *)local_38);
        return;
      }
      if (bVar1 == 0x42) goto LAB_00128d1d;
    }
    else {
      if (bVar1 == 0x4c) goto LAB_00128d13;
      if (bVar1 == 0x58) goto LAB_00128cf5;
    }
  }
  else if (bVar1 < 0x6e) {
    if (bVar1 == 0x62) {
LAB_00128d1d:
      basic_writer<fmt::v6::buffer_range<char>_>::
      int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::on_bin
                ((int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *)local_38);
      return;
    }
    if (bVar1 == 100) goto LAB_00128d09;
  }
  else {
    if (bVar1 == 0x6e) {
LAB_00128d13:
      basic_writer<fmt::v6::buffer_range<char>_>::
      int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::on_num
                ((int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *)local_38);
      return;
    }
    if (bVar1 == 0x6f) {
      basic_writer<fmt::v6::buffer_range<char>_>::
      int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::on_oct
                ((int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *)local_38);
      return;
    }
    if (bVar1 == 0x78) {
LAB_00128cf5:
      basic_writer<fmt::v6::buffer_range<char>_>::
      int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::on_hex
                ((int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *)local_38);
      return;
    }
  }
  basic_writer<fmt::v6::buffer_range<char>_>::
  int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_>::on_error
            ((int_writer<unsigned___int128,_fmt::v6::basic_format_specs<char>_> *)local_38);
}

Assistant:

void write_int(T value, const Spec& spec) {
    handle_int_type_spec(spec.type, int_writer<T, Spec>(*this, value, spec));
  }